

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<char> local_99;
  string local_98;
  path local_78;
  path local_40;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_40,(char (*) [5])"data",auto_format);
  std::filesystem::create_directory(&local_40);
  std::filesystem::__cxx11::path::~path(&local_40);
  std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
            (&local_78,(char (*) [11])"data/3DGen",auto_format);
  std::filesystem::create_directory(&local_78);
  std::filesystem::__cxx11::path::~path(&local_78);
  if ((int)argv_local == 1) {
    UI::interactive_mode();
  }
  else {
    UI::argument_mode((int *)&argv_local,local_18);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Katana Exited.",&local_99)
  ;
  UI::print_ln(&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    //create data folder if doesn't exist
    std::filesystem::create_directory("data");
    std::filesystem::create_directory("data/3DGen");
    if (argc==1)
    {
        UI::interactive_mode();
    }
    else
    {
        UI::argument_mode(argc, argv);
    }
    UI::print_ln("Katana Exited.");
    return 0;
}